

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

Abc_Cex_t * Cec_SplitDeriveModel(Gia_Man_t *p,Cnf_Dat_t *pCnf,sat_solver *pSat)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int *pArray;
  Abc_Cex_t *pAVar4;
  bool bVar5;
  int *pModel;
  int iLit;
  int i;
  Gia_Obj_t *pObj;
  Abc_Cex_t *pCex;
  sat_solver *pSat_local;
  Cnf_Dat_t *pCnf_local;
  Gia_Man_t *p_local;
  
  iVar2 = Gia_ManPiNum(p);
  pArray = (int *)calloc((long)iVar2,4);
  pModel._4_4_ = 0;
  while( true ) {
    iVar2 = Gia_ManPiNum(p);
    bVar5 = false;
    if (pModel._4_4_ < iVar2) {
      _iLit = Gia_ManCi(p,pModel._4_4_);
      bVar5 = _iLit != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    piVar1 = pCnf->pVarNums;
    iVar2 = Gia_ObjId(p,_iLit);
    iVar2 = sat_solver_var_value(pSat,piVar1[iVar2]);
    pArray[pModel._4_4_] = iVar2;
    pModel._4_4_ = pModel._4_4_ + 1;
  }
  if (p->vCofVars != (Vec_Int_t *)0x0) {
    for (pModel._4_4_ = 0; iVar2 = Vec_IntSize(p->vCofVars), pModel._4_4_ < iVar2;
        pModel._4_4_ = pModel._4_4_ + 1) {
      iVar2 = Vec_IntEntry(p->vCofVars,pModel._4_4_);
      iVar3 = Abc_LitIsCompl(iVar2);
      iVar2 = Abc_Lit2Var(iVar2);
      pArray[iVar2] = (uint)((iVar3 != 0 ^ 0xffU) & 1);
    }
  }
  iVar2 = Gia_ManPiNum(p);
  pAVar4 = Abc_CexCreate(0,iVar2,pArray,0,0,0);
  if (pArray != (int *)0x0) {
    free(pArray);
  }
  return pAVar4;
}

Assistant:

Abc_Cex_t * Cec_SplitDeriveModel( Gia_Man_t * p, Cnf_Dat_t * pCnf, sat_solver * pSat )
{
    Abc_Cex_t * pCex;
    Gia_Obj_t * pObj;
    int i, iLit, * pModel;
    pModel = ABC_CALLOC( int, Gia_ManPiNum(p) );
    Gia_ManForEachPi( p, pObj, i )
        pModel[i] = sat_solver_var_value(pSat, pCnf->pVarNums[Gia_ObjId(p, pObj)]);
    if ( p->vCofVars )
        Vec_IntForEachEntry( p->vCofVars, iLit, i )
            pModel[Abc_Lit2Var(iLit)] = !Abc_LitIsCompl(iLit);
    pCex = Abc_CexCreate( 0, Gia_ManPiNum(p), pModel, 0, 0, 0 );
    ABC_FREE( pModel );
    return pCex;
}